

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_AddBoolToObject(cJSON *object,char *name,cJSON_bool boolean)

{
  cJSON_bool cVar1;
  cJSON *bool_item;
  cJSON_bool boolean_local;
  char *name_local;
  cJSON *object_local;
  
  object_local = cJSON_CreateBool(boolean);
  cVar1 = add_item_to_object(object,name,object_local,&global_hooks,0);
  if (cVar1 == 0) {
    cJSON_Delete(object_local);
    object_local = (cJSON *)0x0;
  }
  return object_local;
}

Assistant:

CJSON_PUBLIC(cJSON*) cJSON_AddBoolToObject(cJSON * const object, const char * const name, const cJSON_bool boolean)
{
    cJSON *bool_item = cJSON_CreateBool(boolean);
    if (add_item_to_object(object, name, bool_item, &global_hooks, false))
    {
        return bool_item;
    }

    cJSON_Delete(bool_item);
    return NULL;
}